

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O3

void __thiscall
CStringKMerFactory128::create_kmers
          (CStringKMerFactory128 *this,
          vector<unsigned___int128,_std::allocator<unsigned___int128>_> *mers,char *s)

{
  byte bVar1;
  char cVar2;
  iterator __position;
  unsigned___int128 *puVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  __uint128_t *__args;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar13;
  bool bVar14;
  ulong uVar12;
  
  *(undefined8 *)((long)&(this->super_KMerFactory128).fkmer + 8) = 0;
  *(undefined8 *)&(this->super_KMerFactory128).rkmer = 0;
  (this->super_KMerFactory128).last_unknown = 0;
  *(undefined8 *)&(this->super_KMerFactory128).fkmer = 0;
  *(undefined8 *)((long)&(this->super_KMerFactory128).rkmer + 8) = 0;
  bVar1 = *s;
  if (bVar1 != 0) {
    pbVar8 = (byte *)(s + 1);
    do {
      cVar2 = (this->super_KMerFactory128).b2f._M_elems[bVar1];
      uVar4 = (ulong)(this->super_KMerFactory128).rkmer;
      uVar7 = *(long *)((long)&(this->super_KMerFactory128).rkmer + 8) << 2 | uVar4 >> 0x3e;
      uVar4 = uVar4 * 4;
      if (cVar2 == '\x04') {
        uVar5 = uVar4 & (ulong)(this->super_KMerFactory128).KMER_MASK;
        uVar7 = uVar7 & *(ulong *)((long)&(this->super_KMerFactory128).KMER_MASK + 8);
        uVar4 = *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8);
        uVar13 = (ulong)(this->super_KMerFactory128).fkmer >> 2 | uVar4 << 0x3e;
        bVar1 = (byte)(this->super_KMerFactory128).KMER_FIRSTOFFSET;
        uVar11 = 3L << (bVar1 & 0x3f);
        uVar10 = uVar11;
        uVar9 = 0L << (bVar1 & 0x3f) | 3UL >> 0x40 - (bVar1 & 0x3f);
        if ((bVar1 & 0x40) != 0) {
          uVar10 = 0;
          uVar9 = uVar11;
        }
        uVar11 = uVar10 + uVar13;
        uVar4 = uVar9 + (uVar4 >> 2) + (ulong)CARRY8(uVar10,uVar13);
        lVar6 = 0;
      }
      else {
        uVar9 = (ulong)cVar2;
        uVar5 = uVar4 + uVar9 & (ulong)(this->super_KMerFactory128).KMER_MASK;
        uVar7 = uVar7 + ((long)uVar9 >> 0x3f) + (ulong)CARRY8(uVar4,uVar9) &
                *(ulong *)((long)&(this->super_KMerFactory128).KMER_MASK + 8);
        uVar4 = *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8);
        uVar10 = (ulong)(this->super_KMerFactory128).fkmer >> 2 | uVar4 << 0x3e;
        uVar9 = (ulong)(this->super_KMerFactory128).b2r._M_elems[bVar1];
        bVar1 = (byte)(this->super_KMerFactory128).KMER_FIRSTOFFSET;
        uVar13 = uVar9 << (bVar1 & 0x3f);
        bVar14 = (bVar1 & 0x40) != 0;
        uVar9 = ((long)uVar9 >> 0x3f) << (bVar1 & 0x3f) | uVar9 >> 0x40 - (bVar1 & 0x3f);
        if (bVar14) {
          uVar9 = uVar13;
        }
        uVar12 = 0;
        if (!bVar14) {
          uVar12 = uVar13;
        }
        uVar11 = uVar12 + uVar10;
        uVar4 = uVar9 + (uVar4 >> 2) + (ulong)CARRY8(uVar12,uVar10);
        lVar6 = (this->super_KMerFactory128).last_unknown + 1;
      }
      *(ulong *)&(this->super_KMerFactory128).rkmer = uVar5;
      *(ulong *)((long)&(this->super_KMerFactory128).rkmer + 8) = uVar7;
      (this->super_KMerFactory128).last_unknown = lVar6;
      *(ulong *)&(this->super_KMerFactory128).fkmer = uVar11;
      *(ulong *)((long)&(this->super_KMerFactory128).fkmer + 8) = uVar4;
      if ((long)(ulong)(this->super_KMerFactory128).K <= lVar6) {
        __position._M_current =
             (mers->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        puVar3 = (mers->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>).
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (uVar7 < uVar4 || uVar7 - uVar4 < (ulong)(uVar5 < uVar11)) {
          __args = &(this->super_KMerFactory128).rkmer;
          if (__position._M_current == puVar3) {
LAB_0019f4c7:
            std::vector<unsigned__int128,std::allocator<unsigned__int128>>::
            _M_realloc_insert<unsigned__int128&>
                      ((vector<unsigned__int128,std::allocator<unsigned__int128>> *)mers,__position,
                       __args);
            goto LAB_0019f4cc;
          }
          *(ulong *)__position._M_current = uVar5;
          *(ulong *)((long)__position._M_current + 8) = uVar7;
        }
        else {
          __args = &(this->super_KMerFactory128).fkmer;
          if (__position._M_current == puVar3) goto LAB_0019f4c7;
          *(ulong *)__position._M_current = uVar11;
          *(ulong *)((long)__position._M_current + 8) = uVar4;
        }
        (mers->super__Vector_base<unsigned___int128,_std::allocator<unsigned___int128>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
LAB_0019f4cc:
      bVar1 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    } while (bVar1 != 0);
  }
  return;
}

Assistant:

const void create_kmers(std::vector<__uint128_t> &mers, const char * s) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        while (s[p]!='\0') {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                if (fkmer <= rkmer) {
                    // Is fwd
                    mers.emplace_back(fkmer);
                } else {
                    // Is bwd
                    mers.emplace_back(rkmer);
                }
            }
        }
    }